

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderPassVkImpl::RenderPassVkImpl
          (RenderPassVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
          RenderPassDesc *Desc,bool IsDeviceInternal)

{
  VulkanLogicalDevice *this_00;
  ExtensionFeatures *pEVar1;
  Char *pCVar2;
  undefined1 local_a0 [8];
  string msg_1;
  string msg;
  SubpassDesc *Subpass;
  ulong uStack_50;
  Uint32 i;
  size_t RenderPassVersion;
  ExtensionFeatures *ExtFeats;
  bool IsDeviceInternal_local;
  RenderPassDesc *Desc_local;
  RenderDeviceVkImpl *pDevice_local;
  IReferenceCounters *pRefCounters_local;
  RenderPassVkImpl *this_local;
  
  RenderPassBase<Diligent::EngineVkImplTraits>::RenderPassBase
            (&this->super_RenderPassBase<Diligent::EngineVkImplTraits>,pRefCounters,pDevice,Desc,
             IsDeviceInternal);
  (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
  .super_ObjectBase<Diligent::IRenderPassVk>.super_RefCountedObject<Diligent::IRenderPassVk>.
  super_IRenderPassVk.super_IRenderPass.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_010d3cf8;
  VulkanUtilities::VulkanObjectWrapper<VkRenderPass_T_*,_(VulkanUtilities::VulkanHandleTypeId)8>::
  VulkanObjectWrapper(&this->m_VkRenderPass);
  this_00 = RenderDeviceVkImpl::GetLogicalDevice(pDevice);
  pEVar1 = VulkanUtilities::VulkanLogicalDevice::GetEnabledExtFeatures(this_00);
  uStack_50 = 1;
  if ((pEVar1->ShadingRate).attachmentFragmentShadingRate != 0) {
    for (Subpass._4_4_ = 0;
        Subpass._4_4_ <
        (this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
        .m_Desc.SubpassCount && uStack_50 < 2; Subpass._4_4_ = Subpass._4_4_ + 1) {
      if ((this->super_RenderPassBase<Diligent::EngineVkImplTraits>).
          super_DeviceObjectBase<Diligent::IRenderPassVk,_Diligent::RenderDeviceVkImpl,_Diligent::RenderPassDesc>
          .m_Desc.pSubpasses[Subpass._4_4_].pShadingRateAttachment != (ShadingRateAttachment *)0x0)
      {
        uStack_50 = 2;
      }
    }
    if ((1 < uStack_50) && ((pEVar1->RenderPass2 & 1U) == 0)) {
      FormatString<char[73]>
                ((string *)((long)&msg_1.field_2 + 8),
                 (char (*) [73])
                 "This render pass requires RenderPass2 Vulkan feature that is not enabled");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"RenderPassVkImpl",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
                 ,0x39);
      std::__cxx11::string::~string((string *)(msg_1.field_2._M_local_buf + 8));
    }
  }
  if (uStack_50 == 1) {
    CreateRenderPass<1ul>(this);
  }
  else if (uStack_50 == 2) {
    CreateRenderPass<2ul>(this);
  }
  else {
    FormatString<char[32]>((string *)local_a0,(char (*) [32])"Unsupported render pass version");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"RenderPassVkImpl",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/RenderPassVkImpl.cpp"
               ,0x45);
    std::__cxx11::string::~string((string *)local_a0);
  }
  return;
}

Assistant:

RenderPassVkImpl::RenderPassVkImpl(IReferenceCounters*   pRefCounters,
                                   RenderDeviceVkImpl*   pDevice,
                                   const RenderPassDesc& Desc,
                                   bool                  IsDeviceInternal) :
    TRenderPassBase{pRefCounters, pDevice, Desc, IsDeviceInternal}
{
    const auto& ExtFeats = pDevice->GetLogicalDevice().GetEnabledExtFeatures();

    size_t RenderPassVersion = 1;
    if (ExtFeats.ShadingRate.attachmentFragmentShadingRate)
    {
        for (Uint32 i = 0; i < m_Desc.SubpassCount && RenderPassVersion < 2; ++i)
        {
            const auto& Subpass{m_Desc.pSubpasses[i]};
            if (Subpass.pShadingRateAttachment != nullptr)
                RenderPassVersion = 2;
        }
        DEV_CHECK_ERR(RenderPassVersion < 2 || ExtFeats.RenderPass2 != VK_FALSE,
                      "This render pass requires RenderPass2 Vulkan feature that is not enabled");
    }
    else if (ExtFeats.FragmentDensityMap.fragmentDensityMap)
    {
        // Fragment density map is defined through RenderPassCI.pNext
    }


    switch (RenderPassVersion)
    {
        case 1: CreateRenderPass<1>(); break;
        case 2: CreateRenderPass<2>(); break;
        default: UNSUPPORTED("Unsupported render pass version");
    }
}